

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<double_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,int *rhs)

{
  lest *this_00;
  int *in_R8;
  allocator local_d1;
  long local_d0;
  string local_c8 [32];
  string local_a8;
  string local_88 [32];
  string local_68 [32];
  undefined1 local_48 [40];
  
  this_00 = *(lest **)this;
  local_d0 = -(ulong)((double)*rhs == *(double *)this_00);
  std::__cxx11::string::string(local_68,"==",&local_d1);
  std::__cxx11::string::string(local_c8,local_68);
  to_string<double,int>(&local_a8,this_00,(double *)local_c8,(string *)rhs,in_R8);
  std::__cxx11::string::string(local_88,(string *)&local_a8);
  local_48[0] = (bool)((byte)local_d0 & 1);
  std::__cxx11::string::string((string *)(local_48 + 8),local_88);
  result::result(__return_storage_ptr__,(result *)local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }